

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVectorImpl<char_const*>::append<char_const**,void>
          (SmallVectorImpl<char_const*> *this,char **in_start,char **in_end)

{
  long lVar1;
  ulong uVar2;
  size_t sVar3;
  size_t sVar4;
  size_type NumInputs;
  char **in_end_local;
  char **in_start_local;
  SmallVectorImpl<const_char_*> *this_local;
  
  uVar2 = std::distance<char_const**>(in_start,in_end);
  sVar3 = SmallVectorBase::capacity((SmallVectorBase *)this);
  sVar4 = SmallVectorBase::size((SmallVectorBase *)this);
  if (sVar3 - sVar4 < uVar2) {
    sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
    SmallVectorTemplateBase<const_char_*,_true>::grow
              ((SmallVectorTemplateBase<const_char_*,_true> *)this,sVar3 + uVar2);
  }
  lVar1 = *(long *)this;
  sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
  SmallVectorTemplateBase<char_const*,true>::uninitialized_copy<char_const*,char_const*>
            (in_start,in_end,(char **)(lVar1 + sVar3 * 8),(type *)0x0);
  sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
  SmallVectorBase::set_size((SmallVectorBase *)this,sVar3 + uVar2);
  return;
}

Assistant:

void append(in_iter in_start, in_iter in_end) {
    size_type NumInputs = std::distance(in_start, in_end);
    // Grow allocated space if needed.
    if (NumInputs > this->capacity() - this->size())
      this->grow(this->size()+NumInputs);

    // Copy the new elements over.
    this->uninitialized_copy(in_start, in_end, this->end());
    this->set_size(this->size() + NumInputs);
  }